

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd-wizard.c
# Opt level: O1

void wiz_hack_map_query_feature(chunk *c,void *closure,loc grid,_Bool *show,uint8_t *color)

{
  _Bool _Var1;
  square *psVar2;
  uint8_t uVar3;
  long lVar4;
  
  psVar2 = square((chunk_conflict *)c,grid);
  if (0 < (long)*(int *)((long)closure + 8)) {
    lVar4 = 0;
    do {
      if (*(uint *)(*closure + lVar4 * 4) == (uint)psVar2->feat) {
        *show = true;
        _Var1 = square_ispassable((chunk_conflict *)c,grid);
        uVar3 = '\x04';
        if (_Var1) {
          uVar3 = '\v';
        }
        *color = uVar3;
        return;
      }
      lVar4 = lVar4 + 1;
    } while (*(int *)((long)closure + 8) != lVar4);
  }
  *show = false;
  return;
}

Assistant:

static void wiz_hack_map_query_feature(struct chunk *c, void *closure,
	struct loc grid, bool *show, uint8_t *color)
{
	const struct wiz_query_feature_closure *sel_feats = closure;
	int i = 0;
	int sq_feat = square(c, grid)->feat;

	while (1) {
		if (i >= sel_feats->n) {
			*show = false;
			return;
		}
		if (sq_feat == sel_feats->features[i]) {
			*show = true;
			*color = (square_ispassable(c, grid)) ?
				COLOUR_YELLOW : COLOUR_RED;
			return;
		}
		++i;
	}
}